

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O0

bool __thiscall
rapidjson::
Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
::WriteString(Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
              *this,Ch *str,SizeType length)

{
  GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this_00;
  byte bVar1;
  Ch c_00;
  size_t sVar2;
  undefined1 local_48 [7];
  Ch c;
  GenericStringStream<rapidjson::UTF8<char>_> is;
  SizeType length_local;
  Ch *str_local;
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
  *this_local;
  
  is.head_._4_4_ = length;
  GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Put(this->os_,'\"');
  GenericStringStream<rapidjson::UTF8<char>_>::GenericStringStream
            ((GenericStringStream<rapidjson::UTF8<char>_> *)local_48,str);
  while (sVar2 = GenericStringStream<rapidjson::UTF8<char>_>::Tell
                           ((GenericStringStream<rapidjson::UTF8<char>_> *)local_48),
        sVar2 < is.head_._4_4_) {
    bVar1 = GenericStringStream<rapidjson::UTF8<char>_>::Peek
                      ((GenericStringStream<rapidjson::UTF8<char>_> *)local_48);
    if ("uuuuuuuubtnufruuuuuuuuuuuuuuuuuu"[bVar1] == '\0') {
      this_00 = this->os_;
      c_00 = GenericStringStream<rapidjson::UTF8<char>_>::Take
                       ((GenericStringStream<rapidjson::UTF8<char>_> *)local_48);
      GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Put(this_00,c_00);
    }
    else {
      GenericStringStream<rapidjson::UTF8<char>_>::Take
                ((GenericStringStream<rapidjson::UTF8<char>_> *)local_48);
      GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Put(this->os_,'\\');
      GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Put
                (this->os_,"uuuuuuuubtnufruuuuuuuuuuuuuuuuuu"[bVar1]);
      if ("uuuuuuuubtnufruuuuuuuuuuuuuuuuuu"[bVar1] == 'u') {
        GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Put(this->os_,'0');
        GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Put(this->os_,'0');
        GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Put
                  (this->os_,"0123456789ABCDEF"[(int)(uint)bVar1 >> 4]);
        GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Put
                  (this->os_,"0123456789ABCDEF"[(int)(bVar1 & 0xf)]);
      }
    }
  }
  GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Put(this->os_,'\"');
  return true;
}

Assistant:

bool WriteString(const Ch* str, SizeType length)  {
        static const char hexDigits[16] = { '0', '1', '2', '3', '4', '5', '6', '7', '8', '9', 'A', 'B', 'C', 'D', 'E', 'F' };
        static const char escape[256] = {
#define Z16 0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0
            //0    1    2    3    4    5    6    7    8    9    A    B    C    D    E    F
            'u', 'u', 'u', 'u', 'u', 'u', 'u', 'u', 'b', 't', 'n', 'u', 'f', 'r', 'u', 'u', // 00
            'u', 'u', 'u', 'u', 'u', 'u', 'u', 'u', 'u', 'u', 'u', 'u', 'u', 'u', 'u', 'u', // 10
              0,   0, '"',   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0, // 20
            Z16, Z16,                                                                       // 30~4F
              0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,'\\',   0,   0,   0, // 50
            Z16, Z16, Z16, Z16, Z16, Z16, Z16, Z16, Z16, Z16                                // 60~FF
#undef Z16
        };

        os_->Put('\"');
        GenericStringStream<SourceEncoding> is(str);
        while (is.Tell() < length) {
            const Ch c = is.Peek();
            if (!TargetEncoding::supportUnicode && (unsigned)c >= 0x80) {
                // Unicode escaping
                unsigned codepoint;
                if (!SourceEncoding::Decode(is, &codepoint))
                    return false;
                os_->Put('\\');
                os_->Put('u');
                if (codepoint <= 0xD7FF || (codepoint >= 0xE000 && codepoint <= 0xFFFF)) {
                    os_->Put(hexDigits[(codepoint >> 12) & 15]);
                    os_->Put(hexDigits[(codepoint >>  8) & 15]);
                    os_->Put(hexDigits[(codepoint >>  4) & 15]);
                    os_->Put(hexDigits[(codepoint      ) & 15]);
                }
                else {
                    RAPIDJSON_ASSERT(codepoint >= 0x010000 && codepoint <= 0x10FFFF);
                    // Surrogate pair
                    unsigned s = codepoint - 0x010000;
                    unsigned lead = (s >> 10) + 0xD800;
                    unsigned trail = (s & 0x3FF) + 0xDC00;
                    os_->Put(hexDigits[(lead >> 12) & 15]);
                    os_->Put(hexDigits[(lead >>  8) & 15]);
                    os_->Put(hexDigits[(lead >>  4) & 15]);
                    os_->Put(hexDigits[(lead      ) & 15]);
                    os_->Put('\\');
                    os_->Put('u');
                    os_->Put(hexDigits[(trail >> 12) & 15]);
                    os_->Put(hexDigits[(trail >>  8) & 15]);
                    os_->Put(hexDigits[(trail >>  4) & 15]);
                    os_->Put(hexDigits[(trail      ) & 15]);                    
                }
            }
            else if ((sizeof(Ch) == 1 || (unsigned)c < 256) && escape[(unsigned char)c])  {
                is.Take();
                os_->Put('\\');
                os_->Put(escape[(unsigned char)c]);
                if (escape[(unsigned char)c] == 'u') {
                    os_->Put('0');
                    os_->Put('0');
                    os_->Put(hexDigits[(unsigned char)c >> 4]);
                    os_->Put(hexDigits[(unsigned char)c & 0xF]);
                }
            }
            else
                if (!Transcoder<SourceEncoding, TargetEncoding>::Transcode(is, *os_))
                    return false;
        }
        os_->Put('\"');
        return true;
    }